

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall cmListFileParser::ParseFile(cmListFileParser *this)

{
  bool bVar1;
  int iVar2;
  cmListFileLexer_Token *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  bool bVar6;
  cmListFileLexer_BOM bom;
  ostringstream error;
  cmListFileLexer_BOM local_1cc;
  string local_1c8;
  string local_1a8 [11];
  
  iVar2 = cmListFileLexer_SetFileName(this->Lexer,this->FileName,&local_1cc);
  if (iVar2 == 0) {
    std::__cxx11::string::string
              ((string *)local_1a8,"cmListFileCache: error can not open file.",
               (allocator *)&local_1c8);
    IssueFileOpenError(this,local_1a8);
  }
  else if (local_1cc == cmListFileLexer_BOM_Broken) {
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    std::__cxx11::string::string
              ((string *)local_1a8,"Error while reading Byte-Order-Mark. File not seekable?",
               (allocator *)&local_1c8);
    IssueFileOpenError(this,local_1a8);
  }
  else {
    if ((local_1cc & ~cmListFileLexer_BOM_UTF8) == cmListFileLexer_BOM_None) {
      bVar1 = true;
      do {
        pcVar3 = cmListFileLexer_Scan(this->Lexer);
        bVar6 = pcVar3 == (cmListFileLexer_Token *)0x0;
        if (bVar6) {
          return bVar6;
        }
        switch(pcVar3->type) {
        case cmListFileLexer_Token_Space:
          break;
        case cmListFileLexer_Token_Newline:
          bVar1 = true;
          break;
        case cmListFileLexer_Token_Identifier:
          if (!bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            poVar4 = std::operator<<((ostream *)local_1a8,"Parse error.  Expected a newline, got ");
            pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
            poVar4 = std::operator<<(poVar4,pcVar5);
            poVar4 = std::operator<<(poVar4," with text \"");
            poVar4 = std::operator<<(poVar4,pcVar3->text);
            std::operator<<(poVar4,"\".");
            std::__cxx11::stringbuf::str();
            IssueError(this,&local_1c8);
            goto LAB_003bf2c9;
          }
          bVar1 = ParseFunction(this,pcVar3->text,(long)pcVar3->line);
          if (!bVar1) {
            return bVar6;
          }
          std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
                    (&this->ListFile->Functions,&this->Function);
        case cmListFileLexer_Token_CommentBracket:
          bVar1 = false;
          break;
        default:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          poVar4 = std::operator<<((ostream *)local_1a8,
                                   "Parse error.  Expected a command name, got ");
          pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
          poVar4 = std::operator<<(poVar4,pcVar5);
          poVar4 = std::operator<<(poVar4," with text \"");
          poVar4 = std::operator<<(poVar4,pcVar3->text);
          std::operator<<(poVar4,"\".");
          std::__cxx11::stringbuf::str();
          IssueError(this,&local_1c8);
LAB_003bf2c9:
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          return false;
        }
      } while( true );
    }
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    std::__cxx11::string::string
              ((string *)local_1a8,"File starts with a Byte-Order-Mark that is not UTF-8.",
               (allocator *)&local_1c8);
    IssueFileOpenError(this,local_1a8);
  }
  std::__cxx11::string::~string((string *)local_1a8);
  return false;
}

Assistant:

bool cmListFileParser::ParseFile()
{
  // Open the file.
  cmListFileLexer_BOM bom;
  if (!cmListFileLexer_SetFileName(this->Lexer, this->FileName, &bom)) {
    this->IssueFileOpenError("cmListFileCache: error can not open file.");
    return false;
  }

  if (bom == cmListFileLexer_BOM_Broken) {
    cmListFileLexer_SetFileName(this->Lexer, CM_NULLPTR, CM_NULLPTR);
    this->IssueFileOpenError("Error while reading Byte-Order-Mark. "
                             "File not seekable?");
    return false;
  }

  // Verify the Byte-Order-Mark, if any.
  if (bom != cmListFileLexer_BOM_None && bom != cmListFileLexer_BOM_UTF8) {
    cmListFileLexer_SetFileName(this->Lexer, CM_NULLPTR, CM_NULLPTR);
    this->IssueFileOpenError(
      "File starts with a Byte-Order-Mark that is not UTF-8.");
    return false;
  }

  // Use a simple recursive-descent parser to process the token
  // stream.
  bool haveNewline = true;
  while (cmListFileLexer_Token* token = cmListFileLexer_Scan(this->Lexer)) {
    if (token->type == cmListFileLexer_Token_Space) {
    } else if (token->type == cmListFileLexer_Token_Newline) {
      haveNewline = true;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      haveNewline = false;
    } else if (token->type == cmListFileLexer_Token_Identifier) {
      if (haveNewline) {
        haveNewline = false;
        if (this->ParseFunction(token->text, token->line)) {
          this->ListFile->Functions.push_back(this->Function);
        } else {
          return false;
        }
      } else {
        std::ostringstream error;
        error << "Parse error.  Expected a newline, got "
              << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
              << " with text \"" << token->text << "\".";
        this->IssueError(error.str());
        return false;
      }
    } else {
      std::ostringstream error;
      error << "Parse error.  Expected a command name, got "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }
  return true;
}